

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void kratos::MixedAssignmentVisitor::checkout_assignment(Generator *generator,string *name)

{
  Var *dst_var;
  Var *var_00;
  string *generator_00;
  bool bVar1;
  int iVar2;
  AssignmentType AVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  element_type *peVar5;
  Var **ppVVar6;
  undefined4 extraout_var_00;
  element_type *peVar7;
  undefined4 extraout_var_01;
  size_type __n;
  undefined4 extraout_var_02;
  StmtException *this;
  element_type *stmt_00;
  remove_reference_t<const_std::__cxx11::basic_string<char>_&> *in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_178;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_170 [8];
  __normal_iterator<kratos::Stmt_**,_std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>_>
  local_168;
  __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
  local_160 [8];
  string local_158;
  element_type *local_138;
  __shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *local_130;
  value_type *st;
  const_iterator __end5;
  const_iterator __begin5;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range5;
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmt_list;
  value_type *stmt;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
  *__range2;
  undefined1 local_c0 [4];
  AssignmentType type;
  Generator *local_b0;
  shared_ptr<kratos::Var> *var;
  string *name_local;
  Generator *generator_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_88;
  undefined1 local_78 [40];
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char (*local_48) [47];
  char *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_38;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  element_type *local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  
  var = (shared_ptr<kratos::Var> *)name;
  name_local = (string *)generator;
  Generator::get_var((Generator *)local_c0,(string *)generator);
  __range2._4_4_ = Undefined;
  local_b0 = (Generator *)local_c0;
  peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_c0);
  iVar2 = (*(peVar4->super_IRNode)._vptr_IRNode[0x10])();
  __end2 = std::
           unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
           ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                    *)CONCAT44(extraout_var,iVar2));
  stmt = (value_type *)
         std::
         unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
         ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                *)CONCAT44(extraout_var,iVar2));
  do {
    bVar1 = std::__detail::operator!=
                      (&__end2.super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                       ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false> *)&stmt);
    if (!bVar1) {
      std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)local_c0);
      return;
    }
    stmt_list.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)std::__detail::
                  _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::operator*
                            (&__end2);
    peVar5 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt_list.
                             super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
    ppVVar6 = AssignStmt::left(peVar5);
    iVar2 = (*((*ppVVar6)->super_IRNode)._vptr_IRNode[0x29])();
    peVar7 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)local_b0);
    if ((element_type *)CONCAT44(extraout_var_00,iVar2) == peVar7) {
      if (__range2._4_4_ == Undefined) {
        peVar5 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)stmt_list.
                               super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        __range2._4_4_ = AssignStmt::assign_type(peVar5);
      }
      else {
        peVar5 = std::
                 __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)stmt_list.
                               super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
        AVar3 = AssignStmt::assign_type(peVar5);
        if (__range2._4_4_ != AVar3) {
          std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::vector
                    ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&__range5);
          peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b0);
          iVar2 = (*(peVar4->super_IRNode)._vptr_IRNode[0x10])();
          __n = std::
                unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                ::size((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                        *)CONCAT44(extraout_var_01,iVar2));
          std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::reserve
                    ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)&__range5,__n);
          peVar4 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_b0);
          iVar2 = (*(peVar4->super_IRNode)._vptr_IRNode[0x10])();
          __end5 = std::
                   unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                   ::begin((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                            *)CONCAT44(extraout_var_02,iVar2));
          st = (value_type *)
               std::
               unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
               ::end((unordered_set<std::shared_ptr<kratos::AssignStmt>,_std::hash<std::shared_ptr<kratos::AssignStmt>_>,_std::equal_to<std::shared_ptr<kratos::AssignStmt>_>,_std::allocator<std::shared_ptr<kratos::AssignStmt>_>_>
                      *)CONCAT44(extraout_var_02,iVar2));
          while (bVar1 = std::__detail::operator!=
                                   (&__end5.
                                     super__Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                    ,(_Node_iterator_base<std::shared_ptr<kratos::AssignStmt>,_false>
                                      *)&st), bVar1) {
            local_130 = &std::__detail::
                         _Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
                         operator*(&__end5)->
                         super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>;
            local_138 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                                  (local_130);
            std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::
            emplace_back<kratos::AssignStmt*>
                      ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)&__range5,&local_138);
            std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
            operator++(&__end5);
          }
          this = (StmtException *)__cxa_allocate_exception(0x10);
          local_48 = (char (*) [47])((long)&name_local[3].field_2 + 8);
          local_38._M_allocated_capacity = (size_type)&local_158;
          local_40 = "Mixed assignment detected for variable {0}.{1}";
          vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)var;
          fmt::v7::
          make_args_checked<std::__cxx11::string&,std::__cxx11::string_const&,char[47],char>
                    ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_78,(v7 *)"Mixed assignment detected for variable {0}.{1}",local_48,
                     (remove_reference_t<std::__cxx11::basic_string<char>_&> *)var,in_R8);
          local_78._32_8_ = local_78;
          local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                      )fmt::v7::to_string_view<char,_0>(local_40);
          local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)&generator_local;
          local_38._8_8_ = local_78._32_8_;
          local_20 = (element_type *)local_78._32_8_;
          local_18._8_8_ = local_78._32_8_;
          local_18._M_allocated_capacity = (size_type)local_28;
          fmt::v7::
          basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          ::basic_format_args(local_28,0xdd,
                              (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                               *)local_78._32_8_);
          format_str.size_ = (size_t)generator_local;
          format_str.data_ = (char *)local_88._8_8_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .field_1.values_ = in_R9.values_;
          args.
          super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
          .desc_ = (unsigned_long_long)local_90.values_;
          fmt::v7::detail::vformat_abi_cxx11_
                    (&local_158,(detail *)local_88._M_allocated_capacity,format_str,args);
          local_168._M_current =
               (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::begin
                                  ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)
                                   &__range5);
          __gnu_cxx::
          __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
          ::__normal_iterator<kratos::Stmt**>(local_160,&local_168);
          local_178._M_current =
               (Stmt **)std::vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>::end
                                  ((vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> *)
                                   &__range5);
          __gnu_cxx::
          __normal_iterator<kratos::Stmt*const*,std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>>
          ::__normal_iterator<kratos::Stmt**>(local_170,&local_178);
          StmtException::StmtException
                    (this,&local_158,(const_iterator *)local_160,(const_iterator *)local_170);
          __cxa_throw(this,&StmtException::typeinfo,StmtException::~StmtException);
        }
      }
      generator_00 = name_local;
      peVar5 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt_list.
                             super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      ppVVar6 = AssignStmt::left(peVar5);
      dst_var = *ppVVar6;
      peVar5 = std::
               __shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)stmt_list.
                             super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
      ppVVar6 = AssignStmt::right(peVar5);
      var_00 = *ppVVar6;
      stmt_00 = std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::get
                          ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)
                           stmt_list.
                           super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      check_var_parent((Generator *)generator_00,dst_var,var_00,&stmt_00->super_Stmt);
    }
    std::__detail::_Node_const_iterator<std::shared_ptr<kratos::AssignStmt>,_true,_false>::
    operator++(&__end2);
  } while( true );
}

Assistant:

static void checkout_assignment(Generator* generator, const std::string& name) {
        auto const& var = generator->get_var(name);
        AssignmentType type = AssignmentType::Undefined;
        for (auto const& stmt : var->sources()) {
            if (stmt->left()->get_var_root_parent() != var.get()) continue;
            if (type == AssignmentType ::Undefined)
                type = stmt->assign_type();
            else if (type != stmt->assign_type()) {
                std::vector<Stmt*> stmt_list;
                stmt_list.reserve(var->sources().size());
                for (const auto& st : var->sources()) stmt_list.emplace_back(st.get());
                throw StmtException(::format("Mixed assignment detected for variable {0}.{1}",
                                             generator->name, name),
                                    stmt_list.begin(), stmt_list.end());
            }
            // check assignment
            check_var_parent(generator, stmt->left(), stmt->right(), stmt.get());
        }
    }